

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<int>::data(QList<int> *this)

{
  QArrayDataPointer<int> *this_00;
  int *piVar1;
  QArrayDataPointer<int> *in_RDI;
  
  detach((QList<int> *)0x6393ec);
  this_00 = (QArrayDataPointer<int> *)QArrayDataPointer<int>::operator->(in_RDI);
  piVar1 = QArrayDataPointer<int>::data(this_00);
  return piVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }